

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

Vec_Int_t *
Wlc_NtkGetCoreSels(Gia_Man_t *pFrames,int nFrames,int first_sel_pi,int num_sel_pis,Vec_Bit_t *vMark,
                  int nConfLimit,Wlc_Par_t *pPars,int fSetPO,int RunId)

{
  uint uVar1;
  lit *plVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar6;
  sat_solver *psVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  void *__s;
  Vec_Int_t *p;
  int *piVar11;
  undefined4 in_register_0000000c;
  long lVar12;
  ulong uVar13;
  char *format;
  sat_solver *psVar14;
  int Lit;
  int local_4c;
  sat_solver *local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  pAig = Gia_ManToAigSimple(pFrames);
  pCVar6 = Cnf_Derive(pAig,pAig->nObjs[3]);
  psVar7 = sat_solver_new();
  sat_solver_setnvars(psVar7,pCVar6->nVars);
  if (-1 < (int)vMark) {
    psVar7->RunId = (int)vMark;
    psVar7->pFuncStop = Wla_CallBackToStop;
  }
  lVar12 = 0;
  while (lVar12 < pCVar6->nClauses) {
    iVar3 = sat_solver_addclause(psVar7,pCVar6->pClauses[lVar12],pCVar6->pClauses[lVar12 + 1]);
    lVar12 = lVar12 + 1;
    if (iVar3 == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                    ,0xea,
                    "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                   );
    }
  }
  local_48 = psVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  pVVar10 = pAig->vCos;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      if (pCVar6->pVarNums[*(int *)((long)pVVar10->pArray[lVar12] + 0x24)] < 0) {
        __assert_fail("pCnf->pVarNums[pObj->Id] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                      ,0xf3,
                      "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                     );
      }
      Vec_IntPush(pVVar8,pCVar6->pVarNums[*(int *)((long)pVVar10->pArray[lVar12] + 0x24)] * 2);
      lVar12 = lVar12 + 1;
      pVVar10 = pAig->vCos;
    } while (lVar12 < pVVar10->nSize);
  }
  plVar2 = pVVar8->pArray;
  psVar7 = local_48;
  iVar3 = sat_solver_addclause(local_48,plVar2,plVar2 + pVVar8->nSize);
  if (iVar3 == 0) {
    Abc_Print((int)psVar7,"UNSAT after adding PO clauses.\n");
  }
  if (plVar2 != (lit *)0x0) {
    free(plVar2);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  iVar3 = pCVar6->nVars;
  local_38 = (long)iVar3;
  iVar4 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
  }
  local_40 = pVVar8;
  if (__s != (void *)0x0) {
    memset(__s,0,local_38 * 4);
  }
  if (0 < first_sel_pi) {
    uVar13 = 0;
    do {
      if ((nFrames < 0) || ((long)pAig->vCis->nSize <= (long)((long)nFrames + uVar13))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar3 = pCVar6->pVarNums[*(int *)((long)pAig->vCis->pArray[(long)nFrames + uVar13] + 0x24)];
      if ((long)iVar3 < 0) {
        __assert_fail("var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                      ,0x118,
                      "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                     );
      }
      if ((int)local_38 <= iVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(uint *)((long)__s + (long)iVar3 * 4) = (uint)uVar13;
      local_4c = iVar3 * 2;
      if ((long)*(int *)(CONCAT44(in_register_0000000c,num_sel_pis) + 4) <= (long)uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if ((*(uint *)(*(long *)(CONCAT44(in_register_0000000c,num_sel_pis) + 8) +
                    (uVar13 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar13 & 0x1f) & 1) == 0) {
        sat_solver_addclause(local_48,&local_4c,(lit *)&local_48);
      }
      else {
        Vec_IntPush(local_40,local_4c);
      }
      uVar13 = uVar13 + 1;
    } while ((uint)first_sel_pi != uVar13);
  }
  pVVar8 = local_40;
  psVar7 = local_48;
  plVar2 = local_40->pArray;
  psVar14 = local_48;
  iVar3 = sat_solver_solve(local_48,plVar2,plVar2 + local_40->nSize,0,0,0,0);
  if (iVar3 == 1) {
    format = "SAT.\n";
  }
  else {
    if (iVar3 == -1) {
      Abc_Print((int)psVar14,"UNSAT.\n");
      piVar9 = (psVar7->conf_final).ptr;
      uVar1 = (psVar7->conf_final).size;
      p = (Vec_Int_t *)malloc(0x10);
      uVar5 = 0x10;
      if (0xe < uVar1 - 1) {
        uVar5 = uVar1;
      }
      p->nSize = 0;
      p->nCap = uVar5;
      if (uVar5 == 0) {
        piVar11 = (int *)0x0;
      }
      else {
        piVar11 = (int *)malloc((long)(int)uVar5 << 2);
      }
      p->pArray = piVar11;
      if (0 < (int)uVar1) {
        uVar13 = 0;
        do {
          uVar5 = piVar9[uVar13] >> 1;
          if (((int)uVar5 < 0) || ((int)local_38 <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(p,*(int *)((long)__s + (ulong)uVar5 * 4));
          uVar13 = uVar13 + 1;
          pVVar8 = local_40;
        } while (uVar1 != uVar13);
      }
      goto LAB_0089d44d;
    }
    format = "UNKNOWN.\n";
  }
  p = (Vec_Int_t *)0x0;
  Abc_Print((int)psVar14,format);
LAB_0089d44d:
  if (plVar2 != (lit *)0x0) {
    free(plVar2);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  if (__s != (void *)0x0) {
    free(__s);
  }
  Cnf_ManFree();
  sat_solver_delete(psVar7);
  Aig_ManStop(pAig);
  return p;
}

Assistant:

static Vec_Int_t * Wlc_NtkGetCoreSels( Gia_Man_t * pFrames, int nFrames, int first_sel_pi, int num_sel_pis, Vec_Bit_t * vMark, int nConfLimit, Wlc_Par_t * pPars, int fSetPO, int RunId ) 
{
    Vec_Int_t * vCores = NULL;
    Aig_Man_t * pAigFrames = Gia_ManToAigSimple( pFrames );
    Cnf_Dat_t * pCnf = Cnf_Derive(pAigFrames, Aig_ManCoNum(pAigFrames));
    sat_solver * pSat = sat_solver_new();
    int i;

    sat_solver_setnvars(pSat, pCnf->nVars);
    if ( RunId >= 0 )
    {
        sat_solver_set_runid( pSat, RunId );
        sat_solver_set_stop_func( pSat, Wla_CallBackToStop );
    }

    for (i = 0; i < pCnf->nClauses; i++) 
    {
        if (!sat_solver_addclause(pSat, pCnf->pClauses[i], pCnf->pClauses[i + 1]))
            assert(false);
    }
    // add PO clauses
    {
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Aig_Obj_t* pObj;
        int i, ret;
        Aig_ManForEachCo( pAigFrames, pObj, i )
        {
            assert(pCnf->pVarNums[pObj->Id] >= 0);
            Vec_IntPush(vLits, toLitCond(pCnf->pVarNums[pObj->Id], 0));
        }
        if ( !fSetPO )
        {
            ret = sat_solver_addclause(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits));
            if (!ret) 
                Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
        }
        else
        {
            int Lit;
            for ( i = 0; i < Vec_IntSize(vLits); ++i )
            {
                if ( i == Vec_IntSize(vLits) - 1 )
                    Lit = Vec_IntEntry( vLits, i );
                else
                    Lit = lit_neg(Vec_IntEntry( vLits, i ));
                ret = sat_solver_addclause(pSat, &Lit, &Lit + 1);
                if (!ret) 
                    Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
            }
        }

        Vec_IntFree(vLits);
    }
    
    // main procedure
    {
        int status;
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Vec_Int_t* vMapVar2Sel = Vec_IntStart( pCnf->nVars );
        for ( i = 0; i < num_sel_pis; ++i ) 
        {
            int cur_pi = first_sel_pi + i;
            int var = pCnf->pVarNums[Aig_ManCi(pAigFrames, cur_pi)->Id];
            int Lit;
            assert(var >= 0);
            Vec_IntWriteEntry( vMapVar2Sel, var, i );
            Lit = toLitCond( var, 0 );
            if ( Vec_BitEntry( vMark, i ) )
                Vec_IntPush(vLits, Lit);
            else
                sat_solver_addclause( pSat, &Lit, &Lit+1 );
        }
        /*
            int i, Entry;
            Abc_Print( 1, "#vLits = %d; vLits = ", Vec_IntSize(vLits) );
            Vec_IntForEachEntry(vLits, Entry, i)
                Abc_Print( 1, "%d ", Entry);
            Abc_Print( 1, "\n");
        */
        status = sat_solver_solve(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)(nConfLimit), (ABC_INT64_T)(0), (ABC_INT64_T)(0), (ABC_INT64_T)(0));
        if (status == l_False) {
            int nCoreLits, *pCoreLits;
            Abc_Print( 1, "UNSAT.\n" );
            nCoreLits = sat_solver_final(pSat, &pCoreLits);
            vCores = Vec_IntAlloc( nCoreLits );
            for (i = 0; i < nCoreLits; i++) 
            {
                Vec_IntPush( vCores, Vec_IntEntry( vMapVar2Sel, lit_var( pCoreLits[i] ) ) );
            }
        } else if (status == l_True) {
            Abc_Print( 1, "SAT.\n" );
        } else {
            Abc_Print( 1, "UNKNOWN.\n" );
        }

        Vec_IntFree(vLits);
        Vec_IntFree(vMapVar2Sel);
    }
    Cnf_ManFree();
    sat_solver_delete(pSat);
    Aig_ManStop(pAigFrames);

    return vCores;
}